

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O3

void ourWriteOut(CURL *curl,OutStruct *outs,char *writeinfo)

{
  char cVar1;
  FILE *__stream;
  long lVar2;
  char *pcVar3;
  long lVar4;
  variable *pvVar5;
  char *pcVar6;
  undefined8 uVar7;
  int iVar8;
  FILE *pFVar9;
  char *pcVar10;
  double doubleinfo;
  long longinfo;
  char *stringp;
  undefined8 local_50;
  char *local_48;
  char *local_40;
  OutStruct *local_38;
  
  __stream = _stdout;
  local_38 = outs;
  if (writeinfo == (char *)0x0) {
    return;
  }
  do {
    while (cVar1 = *writeinfo, cVar1 != '%') {
      if (cVar1 == '\\') {
        cVar1 = writeinfo[1];
        if (cVar1 == 't') {
          iVar8 = 9;
        }
        else {
          if (cVar1 != 'r') {
            if (cVar1 == 'n') {
              iVar8 = 10;
              goto LAB_00112d48;
            }
            iVar8 = 0x5c;
            goto LAB_00112d3b;
          }
          iVar8 = 0xd;
        }
LAB_00112d48:
        fputc(iVar8,__stream);
        writeinfo = writeinfo + 2;
      }
      else {
        if (cVar1 == '\0') {
          return;
        }
        fputc((int)cVar1,__stream);
        writeinfo = writeinfo + 1;
      }
    }
    if (writeinfo[1] != '{') {
      if (writeinfo[1] == '%') {
        iVar8 = 0x25;
        goto LAB_00112d48;
      }
LAB_00112d21:
      iVar8 = 0x25;
LAB_00112d3b:
      fputc(iVar8,__stream);
      iVar8 = (int)writeinfo[1];
      goto LAB_00112d48;
    }
    pcVar3 = strchr(writeinfo,0x7d);
    if (pcVar3 == (char *)0x0) goto LAB_00112d21;
    pcVar10 = writeinfo + 2;
    cVar1 = *pcVar3;
    *pcVar3 = '\0';
    iVar8 = curl_strequal(pcVar10,"url_effective");
    pvVar5 = replacements;
    if (iVar8 == 0) {
      lVar2 = 0;
      do {
        lVar4 = lVar2;
        if (lVar4 + 0x10 == 0x180) {
          pcVar6 = "curl: unknown --write-out variable: \'%s\'\n";
          pFVar9 = _stderr;
          goto LAB_00112f1c;
        }
        iVar8 = curl_strequal(pcVar10,*(undefined8 *)((long)&replacements[1].name + lVar4));
        lVar2 = lVar4 + 0x10;
      } while (iVar8 == 0);
      pvVar5 = (variable *)(lVar4 + 0x11dc20);
    }
    pFVar9 = __stream;
    switch(pvVar5->id) {
    case VAR_TOTAL_TIME:
      uVar7 = 0x300003;
      break;
    case VAR_NAMELOOKUP_TIME:
      uVar7 = 0x300004;
      break;
    case VAR_CONNECT_TIME:
      uVar7 = 0x300005;
      break;
    case VAR_APPCONNECT_TIME:
      uVar7 = 0x300021;
      break;
    case VAR_PRETRANSFER_TIME:
      uVar7 = 0x300006;
      break;
    case VAR_STARTTRANSFER_TIME:
      uVar7 = 0x300011;
      break;
    case VAR_SIZE_DOWNLOAD:
      uVar7 = 0x300008;
      goto LAB_00112e52;
    case VAR_SIZE_UPLOAD:
      uVar7 = 0x300007;
LAB_00112e52:
      iVar8 = curl_easy_getinfo(curl,uVar7,&local_50);
      if (iVar8 == 0) {
        pcVar10 = "%.0f";
        goto LAB_00112efc;
      }
      goto switchD_00112d11_default;
    case VAR_SPEED_DOWNLOAD:
      uVar7 = 0x300009;
      break;
    case VAR_SPEED_UPLOAD:
      uVar7 = 0x30000a;
      break;
    case VAR_HTTP_CODE:
      uVar7 = 0x200002;
      goto LAB_00112eb2;
    case VAR_HTTP_CODE_PROXY:
      uVar7 = 0x200016;
LAB_00112eb2:
      iVar8 = curl_easy_getinfo(curl,uVar7,&local_48);
      if (iVar8 == 0) {
        pcVar6 = "%03ld";
        pcVar10 = local_48;
        goto LAB_00112f1c;
      }
      goto switchD_00112d11_default;
    case VAR_HEADER_SIZE:
      uVar7 = 0x20000b;
      goto LAB_00112e84;
    case VAR_REQUEST_SIZE:
      uVar7 = 0x20000c;
      goto LAB_00112e84;
    case VAR_EFFECTIVE_URL:
      uVar7 = 0x100001;
      goto LAB_00112f3b;
    case VAR_CONTENT_TYPE:
      uVar7 = 0x100012;
      goto LAB_00112f3b;
    case VAR_NUM_CONNECTS:
      uVar7 = 0x20001a;
      goto LAB_00112e84;
    case VAR_REDIRECT_TIME:
      uVar7 = 0x300013;
      break;
    case VAR_REDIRECT_COUNT:
      uVar7 = 0x200014;
      goto LAB_00112e84;
    case VAR_FTP_ENTRY_PATH:
      uVar7 = 0x10001e;
      goto LAB_00112f3b;
    case VAR_REDIRECT_URL:
      uVar7 = 0x10001f;
LAB_00112f3b:
      iVar8 = curl_easy_getinfo(curl,uVar7,&local_40);
      if (local_40 != (char *)0x0 && iVar8 == 0) {
        fputs(local_40,__stream);
      }
      goto switchD_00112d11_default;
    case VAR_SSL_VERIFY_RESULT:
      uVar7 = 0x20000d;
LAB_00112e84:
      iVar8 = curl_easy_getinfo(curl,uVar7,&local_48);
      if (iVar8 == 0) {
        pcVar6 = "%ld";
        pcVar10 = local_48;
LAB_00112f1c:
        curl_mfprintf(pFVar9,pcVar6,pcVar10);
      }
      goto switchD_00112d11_default;
    case VAR_EFFECTIVE_FILENAME:
      if (local_38->filename == (char *)0x0) goto switchD_00112d11_default;
      pcVar6 = "%s";
      pcVar10 = local_38->filename;
      goto LAB_00112f1c;
    default:
      goto switchD_00112d11_default;
    }
    iVar8 = curl_easy_getinfo(curl,uVar7,&local_50);
    if (iVar8 == 0) {
      pcVar10 = "%.3f";
LAB_00112efc:
      curl_mfprintf(local_50,__stream,pcVar10);
    }
switchD_00112d11_default:
    writeinfo = pcVar3 + 1;
    *pcVar3 = cVar1;
  } while( true );
}

Assistant:

void ourWriteOut(CURL *curl, struct OutStruct *outs, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        char keepit;
        int i;
        if(('{' == ptr[1]) && ((end = strchr(ptr, '}')) != NULL)) {
          bool match = FALSE;
          ptr += 2; /* pass the % and the { */
          keepit = *end;
          *end = 0; /* zero terminate */
          for(i = 0; replacements[i].name; i++) {
            if(curl_strequal(ptr, replacements[i].name)) {
              match = TRUE;
              switch(replacements[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(outs->filename)
                  fprintf(stream, "%s", outs->filename);
                break;
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}